

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::DecomposeAffine(ON_Xform *this,ON_3dVector *T,ON_Xform *L)

{
  ON_3dVector local_40;
  byte local_21;
  ON_Xform *pOStack_20;
  bool rc;
  ON_Xform *L_local;
  ON_3dVector *T_local;
  ON_Xform *this_local;
  
  pOStack_20 = L;
  L_local = (ON_Xform *)T;
  T_local = (ON_3dVector *)this;
  local_21 = IsAffine(this);
  if ((bool)local_21) {
    ON_3dVector::ON_3dVector(&local_40,this->m_xform[0][3],this->m_xform[1][3],this->m_xform[2][3]);
    L_local->m_xform[0][0] = local_40.x;
    L_local->m_xform[0][1] = local_40.y;
    L_local->m_xform[0][2] = local_40.z;
    memcpy(pOStack_20,this,0x80);
    pOStack_20->m_xform[2][3] = 0.0;
    pOStack_20->m_xform[1][3] = 0.0;
    pOStack_20->m_xform[0][3] = 0.0;
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool ON_Xform::DecomposeAffine(ON_3dVector& T, ON_Xform& L) const
{
	bool rc = IsAffine();
	if (rc)
	{
		T = ON_3dVector(m_xform[0][3], m_xform[1][3], m_xform[2][3]);
		L = (*this);
		L.m_xform[0][3] = L.m_xform[1][3] = L.m_xform[2][3] = 0.0;
	}
	return rc;
}